

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O2

void __thiscall
oout::dirty::Test::Test<std::shared_ptr<oout::NamedTest_const>>
          (Test *this,string *name,shared_ptr<const_oout::NamedTest> *tests)

{
  undefined1 local_38 [32];
  
  std::
  make_shared<oout::NamedTest,std::__cxx11::string_const&,std::shared_ptr<oout::NamedTest_const>const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (shared_ptr<const_oout::NamedTest> *)name);
  local_38._16_8_ = local_38._0_8_;
  local_38._24_8_ = local_38._8_8_;
  local_38._0_8_ = (pointer)0x0;
  local_38._8_8_ = 0;
  Test(this,(shared_ptr<const_oout::Test> *)(local_38 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  return;
}

Assistant:

Test(
		const std::string &name,
		const T & ... tests
	) : Test(std::make_shared<oout::NamedTest>(name, tests...))
	{
	}